

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

void __thiscall EPoller::~EPoller(EPoller *this)

{
  EPoller *this_local;
  
  close(this->epollfd_);
  std::
  unordered_map<int,_std::shared_ptr<Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>_>
  ::~unordered_map(&this->channels_);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::~vector(&this->events_);
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

EPoller::~EPoller() {
    close(epollfd_);
}